

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosXMLUtil.cpp
# Opt level: O0

unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_>
adios2::helper::XMLAttribute(string *attributeName,xml_node *node,string *hint,bool isMandatory)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  xml_attribute activity;
  char_t *pcVar2;
  string *in_RDX;
  __uniq_ptr_data<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>,_true,_true> in_RDI;
  byte in_R8B;
  string nodeName;
  unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_> *attribute;
  pointer in_stack_fffffffffffffe28;
  allocator *paVar3;
  unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_>
  *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char_t *in_stack_fffffffffffffe40;
  xml_node *in_stack_fffffffffffffe48;
  int commRank;
  string *message;
  string *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  undefined1 local_a9 [40];
  undefined1 local_81 [40];
  allocator local_59;
  string local_58 [54];
  undefined1 local_22;
  byte local_21;
  string *local_18;
  
  local_21 = in_R8B & 1;
  local_22 = 0;
  local_18 = in_RDX;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(8);
  message = local_18;
  std::__cxx11::string::c_str();
  activity = pugi::xml_node::attribute(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  *(xml_attribute_struct **)__rhs = activity._attr;
  std::unique_ptr<pugi::xml_attribute,std::default_delete<pugi::xml_attribute>>::
  unique_ptr<std::default_delete<pugi::xml_attribute>,void>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  if (((local_21 & 1) != 0) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_>
                          *)0x9d4aeb), !bVar1)) {
    pcVar2 = pugi::xml_node::name((xml_node *)local_18);
    paVar3 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,pcVar2,paVar3);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_81 + 1),"Helper",(allocator *)__lhs);
    __rhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_a9 + 1),"adiosXMLUtil",(allocator *)__rhs_00);
    paVar3 = &local_d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"XMLAttribute",paVar3);
    std::operator+((char *)message,__rhs);
    commRank = (int)((ulong)__rhs >> 0x20);
    std::operator+(__lhs,(char *)__rhs_00);
    std::operator+(__lhs,__rhs_00);
    std::operator+(__lhs,(char *)__rhs_00);
    std::operator+(__lhs,__rhs_00);
    Throw<std::invalid_argument>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,(string *)activity._attr,message,
               commRank);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe88);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::~string((string *)(local_a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_a9);
    std::__cxx11::string::~string((string *)(local_81 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_81);
    std::__cxx11::string::~string(local_58);
  }
  return (__uniq_ptr_data<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>,_true,_true>
         )(tuple<pugi::xml_attribute_*,_std::default_delete<pugi::xml_attribute>_>)
          in_RDI.
          super___uniq_ptr_impl<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_>._M_t
          .super__Tuple_impl<0UL,_pugi::xml_attribute_*,_std::default_delete<pugi::xml_attribute>_>.
          super__Head_base<0UL,_pugi::xml_attribute_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<pugi::xml_attribute> XMLAttribute(const std::string attributeName,
                                                  const pugi::xml_node &node,
                                                  const std::string hint, const bool isMandatory)
{
    std::unique_ptr<pugi::xml_attribute> attribute(
        new pugi::xml_attribute(node.attribute(attributeName.c_str())));

    if (isMandatory && !attribute)
    {
        const std::string nodeName(node.name());

        helper::Throw<std::invalid_argument>("Helper", "adiosXMLUtil", "XMLAttribute",
                                             "No attribute " + attributeName + " found on <" +
                                                 nodeName + "> element" + hint);
    }
    return attribute;
}